

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O0

void __thiscall
adios2::format::DataManSerializer::Log
          (DataManSerializer *this,int level,string *message,bool mpi,bool endline)

{
  int iVar1;
  ostream *poVar2;
  byte in_CL;
  string *in_RDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  int rank;
  ScopedTimer __var2583;
  void *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff80;
  Comm *in_stack_ffffffffffffff88;
  string local_68 [44];
  int local_3c;
  byte local_1a;
  byte local_19;
  string *local_18;
  int local_c;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  local_c = in_ESI;
  if ((Log(int,std::__cxx11::string_const&,bool,bool)::__var583 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Log(int,std::__cxx11::string_const&,bool,bool)::__var583),
     iVar1 != 0)) {
    in_stack_ffffffffffffff88 =
         (Comm *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                     ,
                                     "void adios2::format::DataManSerializer::Log(const int, const std::string &, const bool, const bool)"
                                     ,0x247);
    Log::__var583 = (void *)ps_timer_create_(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff80 = (string *)Log::__var583;
    __cxa_guard_release(&Log(int,std::__cxx11::string_const&,bool,bool)::__var583);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::string(local_68);
  helper::Comm::World(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar1 = helper::Comm::Rank((Comm *)0xdd3194);
  helper::Comm::~Comm((Comm *)0xdd31a4);
  std::__cxx11::string::~string(local_68);
  local_3c = iVar1;
  if (local_c <= *(int *)(in_RDI + 0x278)) {
    if ((local_19 & 1) != 0) {
      in_stack_ffffffffffffff60 = std::operator<<((ostream *)&std::cout,"[Rank ");
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff60,local_3c);
      std::operator<<(poVar2,"] ");
    }
    std::operator<<((ostream *)&std::cout,local_18);
    if ((local_1a & 1) != 0) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void DataManSerializer::Log(const int level, const std::string &message, const bool mpi,
                            const bool endline)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    const int rank = m_Comm.World().Rank();

    if (m_Verbosity >= level)
    {
        if (mpi)
        {
            std::cout << "[Rank " << rank << "] ";
        }
        std::cout << message;
        if (endline)
        {
            std::cout << std::endl;
        }
    }
}